

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int RunTool(int argCount,char **argValues)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  iterator iVar4;
  ostream *poVar5;
  char *__n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  int i;
  long *plVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string gdsFName;
  string command;
  string outFName;
  string foo;
  gdscpp gdsfile;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  validCommands;
  string local_260;
  char **local_240;
  long *local_238 [2];
  long local_228 [2];
  string local_218;
  long *local_1f8;
  char *local_1f0;
  long local_1e8 [2];
  key_type local_1d8;
  undefined1 local_1b8 [32];
  __node_base_ptr *local_198;
  __node_base_ptr local_188 [2];
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  int *local_158 [2];
  int local_148 [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined1 local_128 [16];
  pointer local_118 [2];
  undefined1 local_108 [16];
  long *local_f8 [2];
  long local_e8 [2];
  string local_d8;
  string local_b8;
  string local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_240 = argValues;
  welcomeScreen();
  if (argCount < 2) {
    return 0;
  }
  local_1b8._0_8_ = local_1b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"-g","");
  local_198 = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"-i","");
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"-r","");
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"-rw","");
  local_138._M_allocated_capacity = (size_type)local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"-rs","");
  local_118[0] = (pointer)local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"-v","");
  plVar6 = local_e8;
  local_f8[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"-h","");
  __l._M_len = 7;
  __l._M_array = (iterator)local_1b8;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_60,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_1f8,(allocator_type *)&local_260);
  lVar9 = -0xe0;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"");
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  uVar7 = 0;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_240[uVar7],(allocator<char> *)&local_218);
    std::__cxx11::string::operator=((string *)&local_1d8,(string *)local_1b8);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&local_60,&local_1d8);
    if ((_Rb_tree_header *)iVar4._M_node != &local_60._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_assign((string *)local_238);
    }
    uVar7 = uVar7 + 1;
  } while ((uint)argCount != uVar7);
  iVar2 = std::__cxx11::string::compare((char *)local_238);
  if (iVar2 == 0) {
    lVar9 = 8;
    pcVar8 = "Invalid.";
    goto LAB_0010414f;
  }
  uVar7 = 0;
  pcVar1 = local_1b8 + 0x10;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_240[uVar7],(allocator<char> *)&local_218);
    std::__cxx11::string::operator=((string *)&local_1d8,(string *)local_1b8);
    if ((pointer)local_1b8._0_8_ != pcVar1) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    __n = (char *)0x4;
    lVar9 = std::__cxx11::string::find((char *)&local_1d8,0x117073,0);
    if (lVar9 == -1) {
      __n = (char *)0x5;
      lVar9 = std::__cxx11::string::find((char *)&local_1d8,0x117050,0);
      iVar2 = (int)uVar7;
      if (lVar9 != -1) goto LAB_00103f68;
    }
    else {
LAB_00103f68:
      std::__cxx11::string::_M_assign((string *)&local_260);
      iVar2 = argCount;
    }
    uVar7 = (ulong)(iVar2 + 1U);
  } while ((int)(iVar2 + 1U) < argCount);
  iVar2 = 2;
  if (2 < argCount) {
    iVar2 = argCount;
  }
  uVar7 = 0;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_240[uVar7],(allocator<char> *)&local_218);
    iVar3 = std::__cxx11::string::compare((char *)local_1b8);
    if ((pointer)local_1b8._0_8_ != pcVar1) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if (iVar3 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b8,local_240[uVar7 + 1],(allocator<char> *)&local_218);
      std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1b8);
      if ((pointer)local_1b8._0_8_ != pcVar1) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
      }
    }
    uVar7 = uVar7 + 1;
  } while (iVar2 - 1 != uVar7);
  iVar2 = std::__cxx11::string::compare((char *)&local_1f8);
  if ((iVar2 == 0) && (iVar2 = std::__cxx11::string::compare((char *)local_238), iVar2 == 0)) {
    __n = "data/results/gds/";
    std::__cxx11::string::_M_replace((ulong)&local_1f8,0,local_1f0,0x117059);
  }
  iVar2 = std::__cxx11::string::compare((char *)local_238);
  if (iVar2 == 0) {
    local_1b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"example1.gds","");
    example1((string *)local_1b8);
    if ((pointer)local_1b8._0_8_ != pcVar1) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    local_1b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"example1.gds","");
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"example2.gds","");
    example2((string *)local_1b8,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
LAB_001044f5:
    iVar2 = 1;
    goto LAB_001044fa;
  }
  iVar2 = std::__cxx11::string::compare((char *)local_238);
  if (iVar2 == 0) {
    iVar2 = std::__cxx11::string::compare((char *)&local_260);
    if (iVar2 != 0) {
      iVar2 = 1;
      gdsToText(&local_260);
      goto LAB_001044fa;
    }
    lVar9 = 0x15;
    pcVar8 = "Input argument error.";
LAB_0010414f:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar9);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)local_238);
    if (iVar2 == 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_260);
      lVar9 = 0x15;
      pcVar8 = "Input argument error.";
      if ((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)&local_1f8), iVar2 != 0)) {
        gdscpp::gdscpp((gdscpp *)local_1b8);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_260._M_dataplus._M_p,
                   local_260._M_dataplus._M_p + local_260._M_string_length);
        gdscpp::import((gdscpp *)local_1b8,&local_98);
        __buf = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          __buf = extraout_RDX_00;
        }
        gdscpp::write((gdscpp *)local_1b8,(int)&local_1f8,__buf,(size_t)__n);
LAB_001044e8:
        gdscpp::~gdscpp((gdscpp *)local_1b8);
        goto LAB_001044f5;
      }
      goto LAB_0010414f;
    }
    iVar2 = std::__cxx11::string::compare((char *)local_238);
    if (iVar2 == 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_260);
      if (iVar2 != 0) {
        gdscpp::gdscpp((gdscpp *)local_1b8);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,local_260._M_dataplus._M_p,
                   local_260._M_dataplus._M_p + local_260._M_string_length);
        gdscpp::import((gdscpp *)local_1b8,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"diagram.jpg","");
        gdscpp::genDot((gdscpp *)local_1b8,&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          uVar7 = local_218.field_2._M_allocated_capacity + 1;
          local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_218._M_dataplus._M_p;
LAB_001044e3:
          operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,uVar7);
        }
        goto LAB_001044e8;
      }
LAB_001045ef:
      lVar9 = 0x15;
      pcVar8 = "Input argument error.";
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)local_238);
      if (iVar2 == 0) {
        iVar2 = std::__cxx11::string::compare((char *)&local_260);
        if (iVar2 != 0) {
          gdscpp::gdscpp((gdscpp *)local_1b8);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,local_260._M_dataplus._M_p,
                     local_260._M_dataplus._M_p + local_260._M_string_length);
          gdscpp::import((gdscpp *)local_1b8,&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          gdscpp::findRootSTR(&local_78,(gdscpp *)local_1b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            uVar7 = (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            goto LAB_001044e3;
          }
          goto LAB_001044e8;
        }
        goto LAB_001045ef;
      }
      iVar2 = std::__cxx11::string::compare((char *)local_238);
      if (iVar2 == 0) {
        if (argCount == 2) {
          *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 2;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Version: ",9);
          poVar5 = std::ostream::_M_insert<double>(0.9);
          iVar2 = 1;
          std::endl<char,std::char_traits<char>>(poVar5);
          goto LAB_001044fa;
        }
        goto LAB_001045ef;
      }
      iVar2 = std::__cxx11::string::compare((char *)local_238);
      if (iVar2 == 0) {
        iVar2 = 1;
        helpScreen();
        goto LAB_001044fa;
      }
      lVar9 = 0x2a;
      pcVar8 = "Quickly catch the smoke before it escapes.";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar9);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  iVar2 = 0;
LAB_001044fa:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return iVar2;
}

Assistant:

int RunTool(int argCount, char **argValues)
{
  welcomeScreen();

  if (argCount <= 1) {
    return 0;
  }

  set<string> validCommands = {"-g", "-i", "-r", "-rw", "-rs", "-v", "-h"};

  string outFName =
      "\0"; // The output file, which is follow by the -o parameter
  string gdsFName = "\0"; // The GDS/GDS2 file
  string command = "\0";  // The command to be executed

  string foo;

  // search for command
  for (int i = 0; i < argCount; i++) {
    foo = string(argValues[i]);
    if (validCommands.find(foo) != validCommands.end()) {
      command = foo;
    }
  }
  if (!command.compare("\0")) {
    cout << "Invalid." << endl;
    return 0;
  }

  // search for gds/gsd2
  for (int i = 0; i < argCount; i++) {
    foo = string(argValues[i]);
    if (foo.find(".gds") != string::npos || foo.find(".gds2") != string::npos) {
      gdsFName = foo;
      i=argCount;
    }
  }

  // search for output filename
  for (int i = 0; i < argCount - 1; i++) {
    if (!string(argValues[i]).compare("-o")) {
      outFName = string(argValues[i + 1]);
    }
  }
  // auto assign output filename if non has been set
  if (!outFName.compare("\0")) {
    if (!command.compare("-g")) {
      outFName = outfileName;
    }
  }

  // Run the commands
  if (!command.compare("-g")) {
    // if (outFName.compare("\0")) {
    example1("example1.gds");
    example2("example1.gds", "example2.gds");
    return 1;
    // } else {
    //   cout << "Input argument error." << endl;
    //   return 0;
    // }
  } else if (!command.compare("-i")) {
    if (gdsFName.compare("\0")) {
      gdsToText(gdsFName);
      return 1;
    } else {
      cout << "Input argument error." << endl;
      return 0;
    }
  } else if (!command.compare("-rw")) {
    if (gdsFName.compare("\0") && outFName.compare("\0")) {
      gdscpp gdsfile;
      gdsfile.import(gdsFName);
      gdsfile.write(outFName);
      return 1;
    } else {
      cout << "Input argument error." << endl;
      return 0;
    }
  } else if (!command.compare("-r")) {
    if (gdsFName.compare("\0")) {
      gdscpp gdsfile;
      gdsfile.import(gdsFName);
      // gdsfile.createHierarchy();
      gdsfile.genDot("diagram.jpg");
      return 1;
    } else {
      cout << "Input argument error." << endl;
      return 0;
    }
  } else if (!command.compare("-rs")) {
    if (gdsFName.compare("\0")) {
      gdscpp gdsfile;
      gdsfile.import(gdsFName);
      gdsfile.findRootSTR();
      return 1;
    } else {
      cout << "Input argument error." << endl;
      return 0;
    }
  } else if (!command.compare("-v")) {
    if (argCount == 1 + 1) {
      cout << setprecision(2);
      cout << "Version: " << versionNo << endl;
      return 1;
    }
    cout << "Input argument error." << endl;
    return 0;
  } else if (!command.compare("-h")) {
    helpScreen();
    return 1;
  } else {
    cout << "Quickly catch the smoke before it escapes." << endl;
    return 0;
  }

  cout << "I am smelling smoke." << endl;
  return 0;
}